

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::PushExpr
          (WatWriter *this,Expr *expr,Index operand_count,Index result_count)

{
  size_type sVar1;
  const_iterator local_90;
  const_iterator local_88;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  *local_80;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  *local_68;
  __normal_iterator<wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>
  local_60;
  __normal_iterator<wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>
  local_58;
  undefined1 local_50 [8];
  ExprTree tree;
  __normal_iterator<wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>
  first_operand;
  iterator last_operand;
  Index result_count_local;
  Index operand_count_local;
  Expr *expr_local;
  WatWriter *this_local;
  
  _result_count_local = expr;
  expr_local = (Expr *)this;
  sVar1 = std::
          vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ::size(&this->expr_tree_stack_);
  if (sVar1 < operand_count) {
    std::
    vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>
    ::emplace_back<wabt::Expr_const*&>
              ((vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>
                *)&this->expr_tree_stack_,(Expr **)&result_count_local);
    FlushExprTreeStack(this);
  }
  else {
    first_operand._M_current =
         (ExprTree *)
         std::
         vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
         ::end(&this->expr_tree_stack_);
    tree.children.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>
                  ::operator-(&first_operand,(ulong)operand_count);
    ExprTree::ExprTree((ExprTree *)local_50,_result_count_local);
    local_58._M_current =
         tree.children.
         super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_60._M_current = first_operand._M_current;
    local_68 = (vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                *)std::
                  back_inserter<std::vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>>
                            ((vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                              *)&tree);
    local_80 = (vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                *)std::
                  move<__gnu_cxx::__normal_iterator<wabt::(anonymous_namespace)::ExprTree*,std::vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>>,std::back_insert_iterator<std::vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>>>
                            (local_58,local_60,
                             (back_insert_iterator<std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>
                              )local_68);
    __gnu_cxx::
    __normal_iterator<wabt::(anonymous_namespace)::ExprTree_const*,std::vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>>
    ::__normal_iterator<wabt::(anonymous_namespace)::ExprTree*>
              ((__normal_iterator<wabt::(anonymous_namespace)::ExprTree_const*,std::vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>>
                *)&local_88,
               (__normal_iterator<wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>
                *)&tree.children.
                   super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<wabt::(anonymous_namespace)::ExprTree_const*,std::vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>>
    ::__normal_iterator<wabt::(anonymous_namespace)::ExprTree*>
              ((__normal_iterator<wabt::(anonymous_namespace)::ExprTree_const*,std::vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>>
                *)&local_90,&first_operand);
    std::
    vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ::erase(&this->expr_tree_stack_,local_88,local_90);
    std::
    vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>
    ::emplace_back<wabt::(anonymous_namespace)::ExprTree&>
              ((vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>
                *)&this->expr_tree_stack_,(ExprTree *)local_50);
    if (result_count == 0) {
      FlushExprTreeStack(this);
    }
    ExprTree::~ExprTree((ExprTree *)local_50);
  }
  return;
}

Assistant:

void WatWriter::PushExpr(const Expr* expr,
                         Index operand_count,
                         Index result_count) {
  WABT_TRACE_ARGS(PushExpr, "%s, %" PRIindex ", %" PRIindex "",
                  GetExprTypeName(*expr), operand_count, result_count);
  if (operand_count <= expr_tree_stack_.size()) {
    auto last_operand = expr_tree_stack_.end();
    auto first_operand = last_operand - operand_count;
    ExprTree tree(expr);
    std::move(first_operand, last_operand, std::back_inserter(tree.children));
    expr_tree_stack_.erase(first_operand, last_operand);
    expr_tree_stack_.emplace_back(tree);
    if (result_count == 0) {
      FlushExprTreeStack();
    }
  } else {
    expr_tree_stack_.emplace_back(expr);
    FlushExprTreeStack();
  }
}